

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

void __thiscall rengine::Node::append(Node *this,Node *child)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  Node *pNVar4;
  bool bVar5;
  
  if (child == (Node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x62,"void rengine::Node::append(Node *)");
  }
  pNVar1 = this->m_child;
  bVar5 = pNVar1 != (Node *)0x0;
  if (pNVar1 != child && bVar5) {
    do {
      pNVar1 = sibling(pNVar1);
      bVar5 = pNVar1 != (Node *)0x0;
      if (pNVar1 == (Node *)0x0) break;
    } while (pNVar1 != child);
  }
  if (bVar5) {
    __assert_fail("!hasChild(child)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,99,"void rengine::Node::append(Node *)");
  }
  if (child->m_parent != (Node *)0x0) {
    __assert_fail("child->m_parent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,100,"void rengine::Node::append(Node *)");
  }
  if (child->m_next != (Node *)0x0) {
    __assert_fail("child->m_next == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x65,"void rengine::Node::append(Node *)");
  }
  if (child->m_prev == (Node *)0x0) {
    ppNVar2 = &this->m_child;
    pNVar1 = *ppNVar2;
    pNVar3 = child;
    pNVar4 = child;
    if (pNVar1 != (Node *)0x0) {
      ppNVar2 = &pNVar1->m_prev;
      pNVar3 = pNVar1->m_prev;
      pNVar3->m_next = child;
      pNVar4 = pNVar1;
    }
    child->m_prev = pNVar3;
    *ppNVar2 = child;
    child->m_next = pNVar4;
    child->m_parent = this;
    return;
  }
  __assert_fail("child->m_prev == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                ,0x66,"void rengine::Node::append(Node *)");
}

Assistant:

void append(Node *child) {
        assert(child);
        assert(!hasChild(child));
        assert(child->m_parent == 0);
        assert(child->m_next == 0);
        assert(child->m_prev == 0);

        if (!m_child) {
            child->m_next = child;
            child->m_prev = child;
            m_child = child;
        } else {
            m_child->m_prev->m_next = child;
            child->m_prev = m_child->m_prev;
            m_child->m_prev = child;
            child->m_next = m_child;
        }
        child->setParent(this);
    }